

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINPrintAllStats(void *kinmem,FILE *outfile,SUNOutputFormat fmt)

{
  void *pvVar1;
  int in_EDX;
  FILE *in_RSI;
  KINMem in_RDI;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x43e,"KINPrintAllStats",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else {
    if (in_EDX == 0) {
      fprintf(in_RSI,"Nonlinear iters         = %li\n",in_RDI->kin_nni);
      fprintf(in_RSI,"Nonlinear fn evals      = %li\n",in_RDI->kin_nfe);
      fprintf(in_RSI,"Beta condition fails    = %li\n",in_RDI->kin_nbcf);
      fprintf(in_RSI,"Backtrack operations    = %li\n",in_RDI->kin_nbktrk);
      fprintf(in_RSI,"Nonlinear fn norm       = %.16g\n",in_RDI->kin_fnorm);
      fprintf(in_RSI,"Step length             = %.16g\n",in_RDI->kin_stepl);
      if (in_RDI->kin_lmem != (void *)0x0) {
        pvVar1 = in_RDI->kin_lmem;
        fprintf(in_RSI,"Jac fn evals            = %ld\n",*(undefined8 *)((long)pvVar1 + 0x38));
        fprintf(in_RSI,"LS Nonlinear fn evals   = %ld\n",*(undefined8 *)((long)pvVar1 + 0x40));
        fprintf(in_RSI,"Prec setup evals        = %ld\n",*(undefined8 *)((long)pvVar1 + 0x48));
        fprintf(in_RSI,"Prec solves             = %ld\n",*(undefined8 *)((long)pvVar1 + 0x58));
        fprintf(in_RSI,"LS iters                = %ld\n",*(undefined8 *)((long)pvVar1 + 0x50));
        fprintf(in_RSI,"LS fails                = %ld\n",*(undefined8 *)((long)pvVar1 + 0x60));
        fprintf(in_RSI,"Jac-times evals         = %ld\n",*(undefined8 *)((long)pvVar1 + 0x68));
        if (0 < in_RDI->kin_nni) {
          fprintf(in_RSI,"LS iters per NLS iter   = %.16g\n",
                  (double)*(long *)((long)pvVar1 + 0x50) / (double)in_RDI->kin_nni);
          fprintf(in_RSI,"Jac evals per NLS iter  = %.16g\n",
                  (double)*(long *)((long)pvVar1 + 0x38) / (double)in_RDI->kin_nni);
          fprintf(in_RSI,"Prec evals per NLS iter = %.16g\n",
                  (double)*(long *)((long)pvVar1 + 0x48) / (double)in_RDI->kin_nni);
        }
      }
    }
    else {
      if (in_EDX != 1) {
        KINProcessError(in_RDI,-2,0x48d,"KINPrintAllStats",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                        ,"Invalid formatting option.");
        return -2;
      }
      fprintf(in_RSI,"Nonlinear iters,%li",in_RDI->kin_nni);
      fprintf(in_RSI,",Nonlinear fn evals,%li",in_RDI->kin_nfe);
      fprintf(in_RSI,",Beta condition fails,%li",in_RDI->kin_nbcf);
      fprintf(in_RSI,",Backtrack operations,%li",in_RDI->kin_nbktrk);
      fprintf(in_RSI,",Nonlinear fn norm,%.16g",in_RDI->kin_fnorm);
      fprintf(in_RSI,",Step length,%.16g",in_RDI->kin_stepl);
      if (in_RDI->kin_lmem != (void *)0x0) {
        pvVar1 = in_RDI->kin_lmem;
        fprintf(in_RSI,",Jac fn evals,%ld",*(undefined8 *)((long)pvVar1 + 0x38));
        fprintf(in_RSI,",LS Nonlinear fn evals,%ld",*(undefined8 *)((long)pvVar1 + 0x40));
        fprintf(in_RSI,",Prec setup evals,%ld",*(undefined8 *)((long)pvVar1 + 0x48));
        fprintf(in_RSI,",Prec solves,%ld",*(undefined8 *)((long)pvVar1 + 0x58));
        fprintf(in_RSI,",LS iters,%ld",*(undefined8 *)((long)pvVar1 + 0x50));
        fprintf(in_RSI,",LS fails,%ld",*(undefined8 *)((long)pvVar1 + 0x60));
        fprintf(in_RSI,",Jac-times evals,%ld",*(undefined8 *)((long)pvVar1 + 0x68));
        if (in_RDI->kin_nni < 1) {
          fprintf(in_RSI,",LS iters per NLS iter,0");
          fprintf(in_RSI,",Jac evals per NLS iter,0");
          fprintf(in_RSI,",Prec evals per NLS iter,0");
        }
        else {
          fprintf(in_RSI,",LS iters per NLS iter,%.16g",
                  (double)*(long *)((long)pvVar1 + 0x50) / (double)in_RDI->kin_nni);
          fprintf(in_RSI,",Jac evals per NLS iter,%.16g",
                  (double)*(long *)((long)pvVar1 + 0x38) / (double)in_RDI->kin_nni);
          fprintf(in_RSI,",Prec evals per NLS iter,%.16g",
                  (double)*(long *)((long)pvVar1 + 0x48) / (double)in_RDI->kin_nni);
        }
      }
      fprintf(in_RSI,"\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINPrintAllStats(void* kinmem, FILE* outfile, SUNOutputFormat fmt)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  switch (fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    /* main solver stats */
    fprintf(outfile, "Nonlinear iters         = %li\n", kin_mem->kin_nni);
    fprintf(outfile, "Nonlinear fn evals      = %li\n", kin_mem->kin_nfe);
    fprintf(outfile, "Beta condition fails    = %li\n", kin_mem->kin_nbcf);
    fprintf(outfile, "Backtrack operations    = %li\n", kin_mem->kin_nbktrk);
    fprintf(outfile, "Nonlinear fn norm       = %" RSYM "\n", kin_mem->kin_fnorm);
    fprintf(outfile, "Step length             = %" RSYM "\n", kin_mem->kin_stepl);

    /* linear solver stats */
    if (kin_mem->kin_lmem)
    {
      kinls_mem = (KINLsMem)(kin_mem->kin_lmem);
      fprintf(outfile, "Jac fn evals            = %ld\n", kinls_mem->nje);
      fprintf(outfile, "LS Nonlinear fn evals   = %ld\n", kinls_mem->nfeDQ);
      fprintf(outfile, "Prec setup evals        = %ld\n", kinls_mem->npe);
      fprintf(outfile, "Prec solves             = %ld\n", kinls_mem->nps);
      fprintf(outfile, "LS iters                = %ld\n", kinls_mem->nli);
      fprintf(outfile, "LS fails                = %ld\n", kinls_mem->ncfl);
      fprintf(outfile, "Jac-times evals         = %ld\n", kinls_mem->njtimes);
      if (kin_mem->kin_nni > 0)
      {
        fprintf(outfile, "LS iters per NLS iter   = %" RSYM "\n",
                (sunrealtype)kinls_mem->nli / (sunrealtype)kin_mem->kin_nni);
        fprintf(outfile, "Jac evals per NLS iter  = %" RSYM "\n",
                (sunrealtype)kinls_mem->nje / (sunrealtype)kin_mem->kin_nni);
        fprintf(outfile, "Prec evals per NLS iter = %" RSYM "\n",
                (sunrealtype)kinls_mem->npe / (sunrealtype)kin_mem->kin_nni);
      }
    }

    break;
  case SUN_OUTPUTFORMAT_CSV:
    /* main solver stats */
    fprintf(outfile, "Nonlinear iters,%li", kin_mem->kin_nni);
    fprintf(outfile, ",Nonlinear fn evals,%li", kin_mem->kin_nfe);
    fprintf(outfile, ",Beta condition fails,%li", kin_mem->kin_nbcf);
    fprintf(outfile, ",Backtrack operations,%li", kin_mem->kin_nbktrk);
    fprintf(outfile, ",Nonlinear fn norm,%" RSYM, kin_mem->kin_fnorm);
    fprintf(outfile, ",Step length,%" RSYM, kin_mem->kin_stepl);

    /* linear solver stats */
    if (kin_mem->kin_lmem)
    {
      kinls_mem = (KINLsMem)(kin_mem->kin_lmem);
      fprintf(outfile, ",Jac fn evals,%ld", kinls_mem->nje);
      fprintf(outfile, ",LS Nonlinear fn evals,%ld", kinls_mem->nfeDQ);
      fprintf(outfile, ",Prec setup evals,%ld", kinls_mem->npe);
      fprintf(outfile, ",Prec solves,%ld", kinls_mem->nps);
      fprintf(outfile, ",LS iters,%ld", kinls_mem->nli);
      fprintf(outfile, ",LS fails,%ld", kinls_mem->ncfl);
      fprintf(outfile, ",Jac-times evals,%ld", kinls_mem->njtimes);
      if (kin_mem->kin_nni > 0)
      {
        fprintf(outfile, ",LS iters per NLS iter,%" RSYM,
                (sunrealtype)kinls_mem->nli / (sunrealtype)kin_mem->kin_nni);
        fprintf(outfile, ",Jac evals per NLS iter,%" RSYM,
                (sunrealtype)kinls_mem->nje / (sunrealtype)kin_mem->kin_nni);
        fprintf(outfile, ",Prec evals per NLS iter,%" RSYM,
                (sunrealtype)kinls_mem->npe / (sunrealtype)kin_mem->kin_nni);
      }
      else
      {
        fprintf(outfile, ",LS iters per NLS iter,0");
        fprintf(outfile, ",Jac evals per NLS iter,0");
        fprintf(outfile, ",Prec evals per NLS iter,0");
      }
    }
    fprintf(outfile, "\n");
    break;
  default:
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid formatting option.");
    return (KIN_ILL_INPUT);
  }

  return (KIN_SUCCESS);
}